

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall
llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,fltSemantics *ourSemantics,integerPart value)

{
  integerPart *piVar1;
  uint uVar2;
  Significand *dst;
  Significand *pSVar3;
  
  this->semantics = ourSemantics;
  uVar2 = ourSemantics->precision + 0x40;
  if (0x7f < uVar2) {
    piVar1 = (integerPart *)operator_new__((ulong)(uVar2 >> 3 & 0xfffffff8));
    (this->significand).parts = piVar1;
  }
  this->field_0x12 = this->field_0x12 & 0xf0 | 2;
  pSVar3 = &this->significand;
  dst = pSVar3;
  if (ourSemantics->precision - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  APInt::tcSet(&dst->part,0,ourSemantics->precision + 0x40 >> 6);
  this->exponent = (short)ourSemantics->precision + -1;
  if (this->semantics->precision - 0x40 < 0xffffff80) {
    pSVar3 = (Significand *)(this->significand).parts;
  }
  pSVar3->part = value;
  normalize(this,rmNearestTiesToEven,lfExactlyZero);
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const fltSemantics &ourSemantics, integerPart value) {
  initialize(&ourSemantics);
  sign = 0;
  category = fcNormal;
  zeroSignificand();
  exponent = ourSemantics.precision - 1;
  significandParts()[0] = value;
  normalize(rmNearestTiesToEven, lfExactlyZero);
}